

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

int nghttp2_frame_pack_rst_stream(nghttp2_bufs *bufs,nghttp2_rst_stream *frame)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  uint8_t *buf;
  
  pnVar2 = bufs->head;
  if (pnVar2 != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x1d0,"int nghttp2_frame_pack_rst_stream(nghttp2_bufs *, nghttp2_rst_stream *)");
  }
  if (3 < (ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last)) {
    buf = (pnVar2->buf).pos + -9;
    (pnVar2->buf).pos = buf;
    nghttp2_frame_pack_frame_hd(buf,&frame->hd);
    nghttp2_put_uint32be((pnVar2->buf).last,frame->error_code);
    ppuVar1 = &(pnVar2->buf).last;
    *ppuVar1 = *ppuVar1 + 4;
    return 0;
  }
  __assert_fail("nghttp2_buf_avail(buf) >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x1d4,"int nghttp2_frame_pack_rst_stream(nghttp2_bufs *, nghttp2_rst_stream *)");
}

Assistant:

int nghttp2_frame_pack_rst_stream(nghttp2_bufs *bufs,
                                  nghttp2_rst_stream *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= 4);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, frame->error_code);
  buf->last += 4;

  return 0;
}